

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_perlin.h
# Opt level: O0

float stb_perlin_noise3_wrap_nonpow2
                (float x,float y,float z,int x_wrap,int y_wrap,int z_wrap,uchar seed)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float t;
  float fVar10;
  float t_00;
  float fVar11;
  float fVar12;
  float a;
  float b;
  float a_00;
  float b_00;
  float a_01;
  int local_bc;
  int local_b8;
  int local_b4;
  int r11;
  int r10;
  int r01;
  int r00;
  int r1;
  int r0;
  int z1;
  int z0;
  int y1;
  int y0;
  int x1;
  int x0;
  int z_wrap2;
  int y_wrap2;
  int x_wrap2;
  int pz;
  int py;
  int px;
  float n1;
  float n0;
  float n11;
  float n10;
  float n01;
  float n00;
  float n111;
  float n110;
  float n101;
  float n100;
  float n011;
  float n010;
  float n001;
  float n000;
  float w;
  float v;
  float u;
  uchar seed_local;
  int z_wrap_local;
  int y_wrap_local;
  int x_wrap_local;
  float z_local;
  float y_local;
  float x_local;
  
  iVar5 = stb__perlin_fastfloor(x);
  iVar6 = stb__perlin_fastfloor(y);
  iVar7 = stb__perlin_fastfloor(z);
  local_b4 = x_wrap;
  if (x_wrap == 0) {
    local_b4 = 0x100;
  }
  local_b8 = y_wrap;
  if (y_wrap == 0) {
    local_b8 = 0x100;
  }
  local_bc = z_wrap;
  if (z_wrap == 0) {
    local_bc = 0x100;
  }
  y0 = iVar5 % local_b4;
  z0 = iVar6 % local_b8;
  r0 = iVar7 % local_bc;
  if (y0 < 0) {
    y0 = local_b4 + y0;
  }
  if (z0 < 0) {
    z0 = local_b8 + z0;
  }
  if (r0 < 0) {
    r0 = local_bc + r0;
  }
  local_b8 = (z0 + 1) % local_b8;
  local_bc = (r0 + 1) % local_bc;
  fVar8 = x - (float)iVar5;
  fVar9 = y - (float)iVar6;
  t = ((fVar9 * 6.0 + -15.0) * fVar9 + 10.0) * fVar9 * fVar9 * fVar9;
  fVar10 = z - (float)iVar7;
  t_00 = ((fVar10 * 6.0 + -15.0) * fVar10 + 10.0) * fVar10 * fVar10 * fVar10;
  bVar1 = stb__perlin_randtab
          [(int)((uint)stb__perlin_randtab[(int)((uint)stb__perlin_randtab[y0] + (uint)seed)] + z0)]
  ;
  bVar2 = stb__perlin_randtab
          [(int)((uint)stb__perlin_randtab[(int)((uint)stb__perlin_randtab[y0] + (uint)seed)] +
                local_b8)];
  bVar3 = stb__perlin_randtab
          [(int)((uint)stb__perlin_randtab
                       [(int)((uint)stb__perlin_randtab[(y0 + 1) % local_b4] + (uint)seed)] + z0)];
  bVar4 = stb__perlin_randtab
          [(int)((uint)stb__perlin_randtab
                       [(int)((uint)stb__perlin_randtab[(y0 + 1) % local_b4] + (uint)seed)] +
                local_b8)];
  fVar11 = stb__perlin_grad((uint)stb__perlin_randtab_grad_idx[(int)((uint)bVar1 + r0)],fVar8,fVar9,
                            fVar10);
  fVar12 = stb__perlin_grad((uint)stb__perlin_randtab_grad_idx[(int)((uint)bVar1 + local_bc)],fVar8,
                            fVar9,fVar10 - 1.0);
  a = stb__perlin_grad((uint)stb__perlin_randtab_grad_idx[(int)((uint)bVar2 + r0)],fVar8,fVar9 - 1.0
                       ,fVar10);
  b = stb__perlin_grad((uint)stb__perlin_randtab_grad_idx[(int)((uint)bVar2 + local_bc)],fVar8,
                       fVar9 - 1.0,fVar10 - 1.0);
  a_00 = stb__perlin_grad((uint)stb__perlin_randtab_grad_idx[(int)((uint)bVar3 + r0)],fVar8 - 1.0,
                          fVar9,fVar10);
  b_00 = stb__perlin_grad((uint)stb__perlin_randtab_grad_idx[(int)((uint)bVar3 + local_bc)],
                          fVar8 - 1.0,fVar9,fVar10 - 1.0);
  a_01 = stb__perlin_grad((uint)stb__perlin_randtab_grad_idx[(int)((uint)bVar4 + r0)],fVar8 - 1.0,
                          fVar9 - 1.0,fVar10);
  fVar9 = stb__perlin_grad((uint)stb__perlin_randtab_grad_idx[(int)((uint)bVar4 + local_bc)],
                           fVar8 - 1.0,fVar9 - 1.0,fVar10 - 1.0);
  fVar10 = stb__perlin_lerp(fVar11,fVar12,t_00);
  fVar11 = stb__perlin_lerp(a,b,t_00);
  fVar12 = stb__perlin_lerp(a_00,b_00,t_00);
  fVar9 = stb__perlin_lerp(a_01,fVar9,t_00);
  fVar10 = stb__perlin_lerp(fVar10,fVar11,t);
  fVar9 = stb__perlin_lerp(fVar12,fVar9,t);
  fVar8 = stb__perlin_lerp(fVar10,fVar9,
                           ((fVar8 * 6.0 + -15.0) * fVar8 + 10.0) * fVar8 * fVar8 * fVar8);
  return fVar8;
}

Assistant:

float stb_perlin_noise3_wrap_nonpow2(float x, float y, float z, int x_wrap, int y_wrap, int z_wrap, unsigned char seed)
{
   float u,v,w;
   float n000,n001,n010,n011,n100,n101,n110,n111;
   float n00,n01,n10,n11;
   float n0,n1;

   int px = stb__perlin_fastfloor(x);
   int py = stb__perlin_fastfloor(y);
   int pz = stb__perlin_fastfloor(z);
   int x_wrap2 = (x_wrap ? x_wrap : 256);
   int y_wrap2 = (y_wrap ? y_wrap : 256);
   int z_wrap2 = (z_wrap ? z_wrap : 256);
   int x0 = px % x_wrap2, x1;
   int y0 = py % y_wrap2, y1;
   int z0 = pz % z_wrap2, z1;
   int r0,r1, r00,r01,r10,r11;

   if (x0 < 0) x0 += x_wrap2;
   if (y0 < 0) y0 += y_wrap2;
   if (z0 < 0) z0 += z_wrap2;
   x1 = (x0+1) % x_wrap2;
   y1 = (y0+1) % y_wrap2;
   z1 = (z0+1) % z_wrap2;

   #define stb__perlin_ease(a)   (((a*6-15)*a + 10) * a * a * a)

   x -= px; u = stb__perlin_ease(x);
   y -= py; v = stb__perlin_ease(y);
   z -= pz; w = stb__perlin_ease(z);

   r0 = stb__perlin_randtab[x0];
   r0 = stb__perlin_randtab[r0+seed];
   r1 = stb__perlin_randtab[x1];
   r1 = stb__perlin_randtab[r1+seed];

   r00 = stb__perlin_randtab[r0+y0];
   r01 = stb__perlin_randtab[r0+y1];
   r10 = stb__perlin_randtab[r1+y0];
   r11 = stb__perlin_randtab[r1+y1];

   n000 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r00+z0], x  , y  , z   );
   n001 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r00+z1], x  , y  , z-1 );
   n010 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r01+z0], x  , y-1, z   );
   n011 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r01+z1], x  , y-1, z-1 );
   n100 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r10+z0], x-1, y  , z   );
   n101 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r10+z1], x-1, y  , z-1 );
   n110 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r11+z0], x-1, y-1, z   );
   n111 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r11+z1], x-1, y-1, z-1 );

   n00 = stb__perlin_lerp(n000,n001,w);
   n01 = stb__perlin_lerp(n010,n011,w);
   n10 = stb__perlin_lerp(n100,n101,w);
   n11 = stb__perlin_lerp(n110,n111,w);

   n0 = stb__perlin_lerp(n00,n01,v);
   n1 = stb__perlin_lerp(n10,n11,v);

   return stb__perlin_lerp(n0,n1,u);
}